

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HSimplexNla.cpp
# Opt level: O0

void __thiscall
HSimplexNla::setPointers
          (HSimplexNla *this,HighsLp *for_lp,HighsSparseMatrix *factor_a_matrix,
          HighsInt *basic_index,HighsOptions *options,HighsTimer *timer,
          HighsSimplexAnalysis *analysis)

{
  HFactor *in_RCX;
  long in_RDX;
  HighsLp *in_RSI;
  HSimplexNla *in_RDI;
  HighsOptions *in_R8;
  HighsTimer *in_R9;
  
  setLpAndScalePointers(in_RDI,in_RSI);
  if (in_RDX != 0) {
    HFactor::setupMatrix(in_RCX,(HighsSparseMatrix *)in_R8);
  }
  if (in_RCX != (HFactor *)0x0) {
    in_RDI->basic_index_ = (HighsInt *)in_RCX;
  }
  if (in_R8 != (HighsOptions *)0x0) {
    in_RDI->options_ = in_R8;
  }
  if (in_R9 != (HighsTimer *)0x0) {
    in_RDI->timer_ = in_R9;
  }
  if (timer != (HighsTimer *)0x0) {
    in_RDI->analysis_ = (HighsSimplexAnalysis *)timer;
  }
  return;
}

Assistant:

void HSimplexNla::setPointers(const HighsLp* for_lp,
                              const HighsSparseMatrix* factor_a_matrix,
                              HighsInt* basic_index,
                              const HighsOptions* options, HighsTimer* timer,
                              HighsSimplexAnalysis* analysis) {
  this->setLpAndScalePointers(for_lp);
  if (factor_a_matrix) factor_.setupMatrix(factor_a_matrix);
  if (basic_index) basic_index_ = basic_index;
  if (options) options_ = options;
  if (timer) timer_ = timer;
  if (analysis) analysis_ = analysis;
}